

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int exprIdxCover(Walker *pWalker,Expr *pExpr)

{
  i16 iVar1;
  int iVar2;
  
  iVar2 = 0;
  if ((pExpr->op == 0xa8) && (pExpr->iTable == ((pWalker->u).pIdxCover)->iCur)) {
    iVar1 = sqlite3TableColumnToIndex(((pWalker->u).pIdxCover)->pIdx,pExpr->iColumn);
    iVar2 = 0;
    if (iVar1 < 0) {
      pWalker->eCode = 1;
      iVar2 = 2;
    }
  }
  return iVar2;
}

Assistant:

static int exprIdxCover(Walker *pWalker, Expr *pExpr){
  if( pExpr->op==TK_COLUMN
   && pExpr->iTable==pWalker->u.pIdxCover->iCur
   && sqlite3TableColumnToIndex(pWalker->u.pIdxCover->pIdx, pExpr->iColumn)<0
  ){
    pWalker->eCode = 1;
    return WRC_Abort;
  }
  return WRC_Continue;
}